

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O3

bool __thiscall
pg::DTLSolver::computeDistanceValues
          (DTLSolver *this,bitset *V,bitset *R,bitset *G,int *val,int player)

{
  bitset *Z;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  size_t sVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  Game *pGVar14;
  int iVar15;
  Game *pGVar16;
  ulong uVar17;
  int max_prio;
  ulong uVar18;
  ulong uVar19;
  uint *puVar20;
  uint uVar21;
  long lVar22;
  int *piVar23;
  bool bVar24;
  ulong local_88;
  ulong local_78;
  int local_64;
  
  Z = &this->Z;
  local_64 = 1;
  do {
    sVar3 = V->_bitssize;
    sVar7 = 0;
    do {
      sVar12 = sVar7;
      if (sVar3 == sVar12) goto LAB_0017d39d;
      sVar7 = sVar12 + 1;
    } while (V->_bits[sVar12] == 0);
    uVar19 = ((this->super_Solver).game)->n_vertices;
    uVar11 = (int)uVar19 - 1;
    if ((int)uVar11 < 0) {
LAB_0017d34d:
      if (0 < (long)uVar19) {
        puVar5 = V->_bits;
        uVar10 = 0;
        do {
          if ((puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
            val[uVar10] = 0x7fffffff;
          }
          uVar10 = uVar10 + 1;
        } while (uVar19 != uVar10);
      }
      sVar7 = (this->Z)._bitssize;
      if (sVar7 != 0) {
        memset(Z->_bits,0,sVar7 << 3);
      }
      goto LAB_0017d39d;
    }
    uVar19 = (ulong)uVar11;
    do {
      uVar10 = uVar19 >> 6;
      if ((V->_bits[uVar10] >> (uVar19 & 0x3f) & 1) != 0) {
        uVar13 = 1L << (uVar19 & 0x3f);
        uVar18 = Z->_bits[uVar10];
        if ((uVar18 & uVar13) == 0) {
          Z->_bits[uVar10] = uVar18 | uVar13;
          this->str[uVar19] = -1;
          iVar15 = (this->Q).pointer;
          (this->Q).pointer = iVar15 + 1;
          (this->Q).queue[iVar15] = (uint)uVar19;
          iVar15 = (this->Q).pointer;
          while (iVar15 != 0) {
            (this->Q).pointer = iVar15 + -1;
            uVar1 = (this->Q).queue[(long)iVar15 + -1];
            attractVertices(this,player,uVar1,R,Z,G,((this->super_Solver).game)->_priority[uVar19]);
            piVar23 = this->tin[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar4 = this->tin[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar23 != piVar4) {
              iVar15 = ((this->super_Solver).game)->_priority[uVar19];
              do {
                attractTangle(this,*piVar23,player,R,Z,G,iVar15);
                piVar23 = piVar23 + 1;
              } while (piVar23 != piVar4);
            }
            iVar15 = (this->Q).pointer;
          }
        }
      }
      bVar24 = 0 < (long)uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar24);
    pGVar14 = (this->super_Solver).game;
    uVar19 = pGVar14->n_vertices;
    uVar11 = (int)uVar19 - 1;
    if ((int)uVar11 < 0) goto LAB_0017d34d;
    puVar5 = V->_bits;
    piVar23 = this->Candidates;
    puVar6 = (this->Z)._bits;
    uVar21 = 0;
    uVar10 = (ulong)uVar11;
    do {
      if ((puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
        piVar4 = pGVar14->_outedges;
        lVar22 = (long)pGVar14->_firstouts[uVar10];
        uVar11 = piVar4[lVar22];
        uVar18 = (ulong)uVar11;
        if ((uint)(((pGVar14->_owner)._bits[uVar10 >> 6] & 1L << (uVar10 & 0x3f)) != 0) == player) {
          if (uVar11 != 0xffffffff) {
            puVar20 = (uint *)(piVar4 + lVar22 + 1);
            do {
              if ((puVar6[(ulong)(long)(int)uVar18 >> 6] >> ((long)(int)uVar18 & 0x3fU) & 1) != 0)
              goto LAB_0017cdee;
              uVar11 = *puVar20;
              uVar18 = (ulong)uVar11;
              puVar20 = puVar20 + 1;
            } while (uVar11 != 0xffffffff);
          }
        }
        else if (uVar11 != 0xffffffff) {
          puVar20 = (uint *)(piVar4 + lVar22);
          bVar24 = false;
          do {
            while( true ) {
              puVar20 = puVar20 + 1;
              uVar13 = (ulong)(long)(int)uVar18 >> 6;
              if ((puVar6[uVar13] >> (uVar18 & 0x3f) & 1) != 0) break;
              if ((G->_bits[uVar13] & 1L << (uVar18 & 0x3f)) != 0) goto LAB_0017cdd5;
              uVar18 = (ulong)*puVar20;
              if (*puVar20 == 0xffffffff) {
                if (!bVar24) goto LAB_0017cdd5;
                goto LAB_0017cdee;
              }
            }
            uVar18 = (ulong)*puVar20;
            bVar24 = true;
          } while (*puVar20 != 0xffffffff);
          goto LAB_0017cdee;
        }
LAB_0017cdd5:
        lVar22 = (long)(int)uVar21;
        uVar21 = uVar21 + 1;
        piVar23[lVar22] = (int)uVar10;
      }
LAB_0017cdee:
      bVar24 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar24);
    if (uVar21 == 0) goto LAB_0017d34d;
    if (-1 < (long)uVar19) {
      local_78 = 0;
      iVar15 = 0;
      pGVar16 = pGVar14;
      max_prio = 0;
LAB_0017ce44:
      local_88 = (long)iVar15;
LAB_0017ce58:
      uVar10 = local_78 >> 6;
      uVar18 = 1L << (local_78 & 0x3f);
      do {
        if (uVar19 == local_78) {
          iVar15 = (this->Q).pointer;
          if (iVar15 == 0) break;
        }
        else {
          if ((R->_bits[uVar10] & uVar18) == 0) goto LAB_0017d0ba;
          puVar5 = Z->_bits;
          if ((puVar5[uVar10] & uVar18) != 0) goto LAB_0017d0ba;
          iVar2 = pGVar14->_priority[local_78];
          iVar15 = (this->Q).pointer;
          if ((iVar2 <= max_prio) || (iVar15 == 0)) {
            piVar23 = pGVar14->_outedges;
            iVar9 = max_prio;
            if (iVar15 == 0) {
              iVar9 = iVar2;
            }
            if (iVar2 <= max_prio) {
              iVar9 = max_prio;
            }
            lVar22 = (long)pGVar14->_firstouts[local_78];
            uVar11 = piVar23[lVar22];
            uVar13 = (ulong)uVar11;
            if ((uint)(((pGVar14->_owner)._bits[uVar10] & uVar18) != 0) == player) {
              if (uVar11 == 0xffffffff) goto LAB_0017d21a;
              puVar20 = (uint *)(piVar23 + lVar22 + 1);
              goto LAB_0017d145;
            }
            if (uVar11 == 0xffffffff) goto LAB_0017d21a;
            puVar20 = (uint *)(piVar23 + lVar22);
            bVar24 = false;
            goto LAB_0017d189;
          }
        }
        do {
          (this->Q).pointer = iVar15 + -1;
          uVar1 = (this->Q).queue[(long)iVar15 + -1];
          attractVertices(this,player,uVar1,R,Z,G,max_prio);
          piVar4 = this->tin[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar23 = this->tin[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start; piVar23 != piVar4; piVar23 = piVar23 + 1
              ) {
            attractTangle(this,*piVar23,player,R,Z,G,max_prio);
          }
          iVar15 = (this->Q).pointer;
        } while (iVar15 != 0);
        pGVar14 = (this->super_Solver).game;
        if (0 < (int)uVar21) {
          uVar19 = 0;
          piVar23 = this->Candidates;
          puVar5 = (this->Z)._bits;
          do {
            uVar13 = (ulong)piVar23[uVar19];
            if (uVar13 != 0xffffffffffffffff) {
              if (pGVar14->_priority[uVar13] <= max_prio) break;
              piVar4 = pGVar14->_outedges;
              lVar22 = (long)pGVar14->_firstouts[uVar13];
              uVar11 = piVar4[lVar22];
              uVar17 = (ulong)uVar11;
              if ((uint)(((pGVar14->_owner)._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) ==
                  player) {
                if (uVar11 != 0xffffffff) {
                  puVar20 = (uint *)(piVar4 + lVar22 + 1);
                  do {
                    if ((puVar5[(ulong)(long)(int)uVar17 >> 6] >> ((long)(int)uVar17 & 0x3fU) & 1)
                        != 0) goto LAB_0017d08b;
                    uVar11 = *puVar20;
                    uVar17 = (ulong)uVar11;
                    puVar20 = puVar20 + 1;
                  } while (uVar11 != 0xffffffff);
                }
              }
              else if (uVar11 != 0xffffffff) {
                puVar20 = (uint *)(piVar4 + lVar22);
                bVar24 = false;
                do {
                  while( true ) {
                    puVar20 = puVar20 + 1;
                    uVar13 = (ulong)(long)(int)uVar17 >> 6;
                    if ((puVar5[uVar13] >> (uVar17 & 0x3f) & 1) != 0) break;
                    if ((G->_bits[uVar13] & 1L << (uVar17 & 0x3f)) != 0) goto LAB_0017d092;
                    uVar17 = (ulong)*puVar20;
                    if (*puVar20 == 0xffffffff) {
                      if (!bVar24) goto LAB_0017d092;
                      goto LAB_0017d08b;
                    }
                  }
                  uVar17 = (ulong)*puVar20;
                  bVar24 = true;
                } while (*puVar20 != 0xffffffff);
LAB_0017d08b:
                piVar23[uVar19] = -1;
              }
            }
LAB_0017d092:
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar21);
        }
        uVar19 = pGVar14->n_vertices;
        pGVar16 = pGVar14;
        if ((long)uVar19 < (long)local_78) break;
      } while( true );
    }
LAB_0017d24c:
    if ((int)uVar21 < 1) {
      bVar24 = false;
    }
    else {
      piVar23 = this->Candidates;
      uVar19 = 0;
      bVar24 = false;
      puVar5 = V->_bits;
      do {
        iVar15 = piVar23[uVar19];
        uVar10 = (ulong)iVar15;
        if (uVar10 != 0xffffffffffffffff) {
          bVar24 = true;
          val[uVar10] = local_64;
          bVar8 = (byte)iVar15 & 0x3f;
          puVar5[uVar10 >> 6] =
               puVar5[uVar10 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        uVar19 = uVar19 + 1;
      } while (uVar21 != uVar19);
    }
    sVar7 = (this->Z)._bitssize;
    if (sVar7 != 0) {
      memset(Z->_bits,0,sVar7 << 3);
    }
    local_64 = local_64 + 1;
  } while (bVar24);
  uVar19 = pGVar14->n_vertices;
  if (0 < (long)uVar19) {
    puVar5 = V->_bits;
    uVar10 = 0;
    do {
      if ((puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
        val[uVar10] = 0x7fffffff;
      }
      uVar10 = uVar10 + 1;
    } while (uVar19 != uVar10);
  }
LAB_0017d39d:
  return sVar3 != sVar12;
LAB_0017d0ba:
  uVar19 = pGVar16->n_vertices;
  local_78 = local_88 + 1;
  bVar24 = (long)uVar19 <= (long)local_88;
  pGVar14 = pGVar16;
  local_88 = local_78;
  if (bVar24) goto LAB_0017d24c;
  goto LAB_0017ce58;
  while( true ) {
    if ((G->_bits[uVar17] & 1L << (uVar13 & 0x3f)) != 0) goto LAB_0017d21a;
    uVar13 = (ulong)*puVar20;
    if (*puVar20 == 0xffffffff) break;
LAB_0017d189:
    puVar20 = puVar20 + 1;
    uVar17 = (ulong)(long)(int)uVar13 >> 6;
    if ((puVar5[uVar17] >> (uVar13 & 0x3f) & 1) != 0) {
      uVar13 = (ulong)*puVar20;
      bVar24 = true;
      if (*puVar20 == 0xffffffff) goto LAB_0017d1e9;
      goto LAB_0017d189;
    }
  }
  if (bVar24) {
LAB_0017d1e9:
    puVar5[uVar10] = puVar5[uVar10] | uVar18;
    (this->Q).pointer = iVar15 + 1;
    (this->Q).queue[iVar15] = (uint)local_88;
    uVar19 = pGVar14->n_vertices;
  }
LAB_0017d21a:
  iVar15 = (uint)local_88 + 1;
  local_78 = (ulong)iVar15;
  max_prio = iVar9;
  if ((long)uVar19 < (long)local_78) goto LAB_0017d24c;
  goto LAB_0017ce44;
  while( true ) {
    uVar11 = *puVar20;
    uVar13 = (ulong)uVar11;
    puVar20 = puVar20 + 1;
    if (uVar11 == 0xffffffff) break;
LAB_0017d145:
    if ((puVar5[(ulong)(long)(int)uVar13 >> 6] >> ((long)(int)uVar13 & 0x3fU) & 1) != 0)
    goto LAB_0017d1e9;
  }
  goto LAB_0017d21a;
}

Assistant:

bool
DTLSolver::computeDistanceValues(bitset &V, bitset &R, bitset &G, int* val, const int player)
{
    int dist = 1; // start distance 1

    while (V.any()) {
        // make the partition (attract lower to higher)
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                Z[top] = true;
                str[top] = -1; // avoid valgrind warnings...
                Q.push(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(player, v, R, Z, G, priority(top));
                    attractTangles(player, v, R, Z, G, priority(top));
                }
            }
        }

        // find candidate vertices to remove from V
        int n_candidates = 0;

        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, G)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            Z.reset();
            return true;
        }

        // attract higher to lower
        int t = 0;
        for (int v=0; v<=nodecount();) {
            if (v == nodecount()) {
                if (Q.empty()) break;
            } else if (!R[v] or Z[v]) {
                v++;
                continue; // only attract vertices in <R\Z>
            } else {
                if (priority(v) > t and Q.empty()) t = priority(v);
                if (priority(v) <= t) {
                    if (attracts(player, v, Z, G)) {
                        Z[v] = true;
                        Q.push(v);
                    }
                    v++;
                    continue;
                } 
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, G, t);
                attractTangles(player, u, R, Z, G, t);
            }

            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u == -1) continue;
                if (priority(u) <= t) break; // stop checking once we are below the threshold
                if (attracts(player, u, Z, G)) Candidates[x] = -1;
            }
        }

        // remaining Candidates have no path from high to low, remove them from V

        bool V_changed = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            val[u] = dist;
            V[u] = false;
            V_changed = true;
        }

        Z.reset();
        dist++;

        if (!V_changed) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            return true;
        }
    }

    return false;
}